

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall TestValueTestmemberCount::runTestCase(TestValueTestmemberCount *this)

{
  TestResult *pTVar1;
  PredicateContext local_48;
  
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x95;
  local_48.expr_ = "checkMemberCount(emptyArray_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).emptyArray_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x96;
  local_48.expr_ = "checkMemberCount(emptyObject_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).emptyObject_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x97;
  local_48.expr_ = "checkMemberCount(array1_, 1)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).array1_,1);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x98;
  local_48.expr_ = "checkMemberCount(object1_, 1)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).object1_,1);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x99;
  local_48.expr_ = "checkMemberCount(null_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).null_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9a;
  local_48.expr_ = "checkMemberCount(integer_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).integer_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9b;
  local_48.expr_ = "checkMemberCount(unsignedInteger_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).unsignedInteger_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9c;
  local_48.expr_ = "checkMemberCount(smallUnsignedInteger_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount
            (&this->super_ValueTest,&(this->super_ValueTest).smallUnsignedInteger_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9d;
  local_48.expr_ = "checkMemberCount(real_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).real_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9e;
  local_48.expr_ = "checkMemberCount(emptyString_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).emptyString_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0x9f;
  local_48.expr_ = "checkMemberCount(string_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).string_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  pTVar1 = (this->super_ValueTest).super_TestCase.result_;
  local_48.id_ = pTVar1->predicateId_;
  local_48.file_ =
       "/workspace/llm4binary/github/license_all_cmakelists_25/HBM[P]cppstream/jsoncpp/src/test_lib_json/main.cpp"
  ;
  local_48.line_ = 0xa0;
  local_48.expr_ = "checkMemberCount(true_, 0)";
  local_48.next_ = (PredicateContext *)0x0;
  local_48.failure_ = (Failure *)0x0;
  pTVar1->predicateStackTail_->next_ = &local_48;
  pTVar1->predicateId_ = local_48.id_ + 1;
  pTVar1->predicateStackTail_ = &local_48;
  ValueTest::checkMemberCount(&this->super_ValueTest,&(this->super_ValueTest).true_,0);
  JsonTest::TestResult::popPredicateContext((this->super_ValueTest).super_TestCase.result_);
  return;
}

Assistant:

JSONTEST_FIXTURE(ValueTest, memberCount) {
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyArray_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyObject_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(array1_, 1));
  JSONTEST_ASSERT_PRED(checkMemberCount(object1_, 1));
  JSONTEST_ASSERT_PRED(checkMemberCount(null_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(integer_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(unsignedInteger_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(smallUnsignedInteger_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(real_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(emptyString_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(string_, 0));
  JSONTEST_ASSERT_PRED(checkMemberCount(true_, 0));
}